

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

string * cxx_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  
  __s = getenv("CXX");
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (__s != (char *)0x0) {
    strlen(__s);
  }
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string cxx() {
  if (auto cpp = std::getenv("CXX")) {
    return cpp;
  }

#if defined(__CLANG__)
  return "clang++";
#elif defined(__GCC__)
  return "g++";
#elif defined(__MSVC__)
#if defined(__clang__)
  return "clang-cl";
#else
  return "cl";
#endif
#endif
}